

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O1

char * __thiscall
cmCommandArgumentParserHelper::CombineUnions
          (cmCommandArgumentParserHelper *this,char *in1,char *in2)

{
  pointer *pppcVar1;
  iterator __position;
  size_t sVar2;
  size_t sVar3;
  char *__dest;
  char *out;
  char *local_28;
  
  local_28 = in2;
  if ((in1 != (char *)0x0) && (local_28 = in1, in2 != (char *)0x0)) {
    sVar2 = strlen(in1);
    sVar3 = strlen(in2);
    __dest = (char *)operator_new__(sVar2 + sVar3 + 1);
    local_28 = __dest;
    strcpy(__dest,in1);
    strcat(__dest,in2);
    __position._M_current =
         (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char*,std::allocator<char*>>::_M_realloc_insert<char*const&>
                ((vector<char*,std::allocator<char*>> *)&this->Variables,__position,&local_28);
    }
    else {
      *__position._M_current = __dest;
      pppcVar1 = &(this->Variables).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return local_28;
}

Assistant:

char* cmCommandArgumentParserHelper::CombineUnions(char* in1, char* in2)
{
  if ( !in1 )
    {
    return in2;
    }
  else if ( !in2 )
    {
    return in1;
    }
  size_t len = strlen(in1) + strlen(in2) + 1;
  char* out = new char [ len ];
  strcpy(out, in1);
  strcat(out, in2);
  this->Variables.push_back(out);
  return out;
}